

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O3

void __thiscall re2c::Linear::~Linear(Linear *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Cond *pCVar2;
  pointer pcVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  pointer ppVar7;
  
  ppVar7 = (this->branches).
           super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->branches).
      super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar7) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      pCVar2 = ppVar7[uVar5].first;
      if (pCVar2 != (Cond *)0x0) {
        pcVar3 = (pCVar2->compare)._M_dataplus._M_p;
        paVar1 = &(pCVar2->compare).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pCVar2,0x28);
      ppVar7 = (this->branches).
               super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar6 < (ulong)((long)(this->branches).
                                    super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar7 >> 4);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar4);
  }
  if (ppVar7 != (pointer)0x0) {
    operator_delete(ppVar7,(long)(this->branches).
                                 super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar7);
    return;
  }
  return;
}

Assistant:

Linear::~Linear ()
{
	for (uint32_t i = 0; i < branches.size (); ++i)
	{
		delete branches[i].first;
	}
}